

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_utility.cpp
# Opt level: O1

void FCanvasTextureInfo::UpdateAll(void)

{
  FCanvasTexture *pFVar1;
  FCanvasTextureInfo **ppFVar2;
  AActor *pAVar3;
  FCanvasTextureInfo *pFVar4;
  
  pFVar4 = List;
  if (List != (FCanvasTextureInfo *)0x0) {
    do {
      pAVar3 = (pFVar4->Viewpoint).field_0.p;
      if (pAVar3 != (AActor *)0x0) {
        if (((pAVar3->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
          pFVar1 = pFVar4->Texture;
          if (pFVar1->bNeedsUpdate == true) {
            pAVar3 = (pFVar4->Viewpoint).field_0.p;
            if ((pAVar3 != (AActor *)0x0) &&
               (((pAVar3->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
              (pFVar4->Viewpoint).field_0.p = (AActor *)0x0;
              pAVar3 = (AActor *)0x0;
            }
            (*Renderer->_vptr_FRenderer[0x13])(Renderer,pFVar1,pAVar3,(ulong)(uint)pFVar4->FOV);
          }
        }
        else {
          (pFVar4->Viewpoint).field_0.p = (AActor *)0x0;
        }
      }
      ppFVar2 = &pFVar4->Next;
      pFVar4 = *ppFVar2;
    } while (*ppFVar2 != (FCanvasTextureInfo *)0x0);
  }
  return;
}

Assistant:

void FCanvasTextureInfo::UpdateAll ()
{
	FCanvasTextureInfo *probe;

	for (probe = List; probe != NULL; probe = probe->Next)
	{
		if (probe->Viewpoint != NULL && probe->Texture->bNeedsUpdate)
		{
			Renderer->RenderTextureView(probe->Texture, probe->Viewpoint, probe->FOV);
		}
	}
}